

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall logloss::wexpmx(logloss *this,float x)

{
  float in_XMM0_Da;
  double __x;
  double dVar1;
  double dVar2;
  double u;
  double t;
  double r;
  double w;
  undefined8 local_40;
  
  if (in_XMM0_Da < 1.0) {
    __x = exp((double)in_XMM0_Da * 0.8 + -0.65);
    local_40 = (double)in_XMM0_Da * 0.2 + 0.65;
  }
  else {
    __x = (double)in_XMM0_Da * 0.86 + 0.01;
    local_40 = log(__x);
    local_40 = (double)in_XMM0_Da - local_40;
  }
  local_40 = local_40 - __x;
  dVar1 = __x + 1.0;
  dVar2 = dVar1 * 2.0 * (dVar1 + (local_40 * 2.0) / 3.0);
  return (float)(__x * (((local_40 / dVar1) * (dVar2 - local_40)) / (dVar2 - (local_40 + local_40))
                       + 1.0) + -(double)in_XMM0_Da);
}

Assistant:

inline float wexpmx(float x)
  {
    /* This piece of code is approximating W(exp(x))-x.
     * W is the Lambert W function: W(z)*exp(W(z))=z.
     * The absolute error of this approximation is less than 9e-5.
     * Faster/better approximations can be substituted here.
     */
    double w = x >= 1. ? 0.86 * x + 0.01 : correctedExp(0.8 * x - 0.65);  // initial guess
    double r = x >= 1. ? x - log(w) - w : 0.2 * x + 0.65 - w;             // residual
    double t = 1. + w;
    double u = 2. * t * (t + 2. * r / 3.);                          // magic
    return (float)(w * (1. + r / t * (u - r) / (u - 2. * r)) - x);  // more magic
  }